

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O2

int __thiscall
Function::clone(Function *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  _func_int **local_80;
  Context local_78;
  
  Context::clone(&local_78,__fn + 0x38,__child_stack,__flags,__arg);
  std::
  make_unique<Function,TypeName_const&,std::__cxx11::list<std::pair<std::__cxx11::string,TypeName>,std::allocator<std::pair<std::__cxx11::string,TypeName>>>const&,std::shared_ptr<BlockNode>const&,Context>
            ((TypeName *)&local_80,
             (list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
              *)(__fn + 0xc),(shared_ptr<BlockNode> *)(__fn + 0x10),(Context *)(__fn + 0x28));
  (this->super_Value)._vptr_Value = local_80;
  local_80 = (_func_int **)0x0;
  std::
  deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
  ::~deque(&local_78.scopes_);
  return (int)this;
}

Assistant:

std::unique_ptr<Value> Function::clone() const
{
  return std::make_unique<Function>(returnType_, arguments_, body_, context_.clone());
}